

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint32_t __thiscall
google::protobuf::io::CodedInputStream::ReadTagFallback
          (CodedInputStream *this,uint32_t first_byte_or_zero)

{
  long lVar1;
  char *pcVar2;
  undefined1 *puVar3;
  int iVar4;
  string *psVar5;
  uint32_t uVar6;
  size_type sVar7;
  int iVar8;
  long lVar10;
  undefined8 uVar11;
  pointer pcVar12;
  undefined1 *puVar13;
  int local_2c;
  uint32_t local_28 [4];
  int iVar9;
  
  iVar4 = (int)*(undefined1 **)this;
  iVar9 = (int)*(long *)(this + 8);
  iVar8 = iVar9 - iVar4;
  if (9 < iVar8) {
LAB_0015e2eb:
    local_28[0] = first_byte_or_zero;
    local_2c._0_1_ = **(undefined1 **)this;
    psVar5 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_int,unsigned_char>
                       (local_28,(uchar *)&local_2c,"first_byte_or_zero == buffer_[0]");
    if (psVar5 == (string *)0x0) {
      puVar3 = *(undefined1 **)this;
      if (first_byte_or_zero == 0) {
        *(undefined1 **)this = puVar3 + 1;
        return 0;
      }
      local_2c._0_1_ = *puVar3;
      local_28[0] = first_byte_or_zero;
      psVar5 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_char,unsigned_int>
                         ((uchar *)&local_2c,local_28,"*buffer == first_byte");
      if (psVar5 == (string *)0x0) {
        local_28[0] = first_byte_or_zero & 0x80;
        local_2c = 0x80;
        psVar5 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_int,int>
                           (local_28,&local_2c,"first_byte & 0x80 == 0x80");
        if (psVar5 != (string *)0x0) {
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_28,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
                     ,0x1ae,psVar5->_M_string_length,(psVar5->_M_dataplus)._M_p);
          absl::lts_20240722::log_internal::LogMessage::operator<<
                    ((LogMessage *)local_28,first_byte_or_zero);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)local_28);
        }
        uVar6 = ((uint)(byte)puVar3[1] * 0x80 + first_byte_or_zero) - 0x80;
        if ((char)puVar3[1] < '\0') {
          uVar6 = (uVar6 + (uint)(byte)puVar3[2] * 0x4000) - 0x4000;
          if ((char)puVar3[2] < '\0') {
            uVar6 = (uVar6 + (uint)(byte)puVar3[3] * 0x200000) - 0x200000;
            if ((char)puVar3[3] < '\0') {
              puVar13 = puVar3 + 5;
              uVar6 = uVar6 + (uint)(byte)puVar3[4] * 0x10000000 + 0xf0000000;
              if ((char)puVar3[4] < '\0') {
                lVar10 = 0;
                do {
                  if ((int)lVar10 == 5) {
                    return 0;
                  }
                  lVar1 = lVar10 + 1;
                  pcVar2 = puVar13 + lVar10;
                  lVar10 = lVar1;
                } while (*pcVar2 < '\0');
                puVar13 = puVar13 + lVar1;
              }
            }
            else {
              puVar13 = puVar3 + 4;
            }
          }
          else {
            puVar13 = puVar3 + 3;
          }
        }
        else {
          puVar13 = puVar3 + 2;
        }
        *(undefined1 **)this = puVar13;
        return uVar6;
      }
      pcVar12 = (psVar5->_M_dataplus)._M_p;
      sVar7 = psVar5->_M_string_length;
      uVar11 = 0x1ad;
    }
    else {
      pcVar12 = (psVar5->_M_dataplus)._M_p;
      sVar7 = psVar5->_M_string_length;
      uVar11 = 0x251;
    }
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
               ,uVar11,sVar7,pcVar12);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28)
    ;
  }
  if (iVar8 < 1) {
    if (iVar9 == iVar4) {
      if (((0 < *(int *)(this + 0x2c)) || (*(int *)(this + 0x18) == *(int *)(this + 0x28))) &&
         (*(int *)(this + 0x18) - *(int *)(this + 0x2c) < *(int *)(this + 0x30))) {
        this[0x24] = (CodedInputStream)0x1;
        return 0;
      }
    }
  }
  else if (-1 < *(char *)(*(long *)(this + 8) + -1)) goto LAB_0015e2eb;
  uVar6 = ReadTagSlow(this);
  return uVar6;
}

Assistant:

uint32_t CodedInputStream::ReadTagFallback(uint32_t first_byte_or_zero) {
  const int buf_size = BufferSize();
  if (buf_size >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buf_size > 0 && !(buffer_end_[-1] & 0x80))) {
    ABSL_DCHECK_EQ(first_byte_or_zero, buffer_[0]);
    if (first_byte_or_zero == 0) {
      ++buffer_;
      return 0;
    }
    uint32_t tag;
    ::std::pair<bool, const uint8_t*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &tag);
    if (!p.first) {
      return 0;
    }
    buffer_ = p.second;
    return tag;
  } else {
    // We are commonly at a limit when attempting to read tags. Try to quickly
    // detect this case without making another function call.
    if ((buf_size == 0) &&
        ((buffer_size_after_limit_ > 0) ||
         (total_bytes_read_ == current_limit_)) &&
        // Make sure that the limit we hit is not total_bytes_limit_, since
        // in that case we still need to call Refresh() so that it prints an
        // error.
        total_bytes_read_ - buffer_size_after_limit_ < total_bytes_limit_) {
      // We hit a byte limit.
      legitimate_message_end_ = true;
      return 0;
    }
    return ReadTagSlow();
  }
}